

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_script.cpp
# Opt level: O3

void __thiscall DFraggleThinker::DFraggleThinker(DFraggleThinker *this)

{
  DObject *pDVar1;
  DFsScript *pDVar2;
  DRunningScript *this_00;
  DFsScript *this_01;
  
  DThinker::DThinker(&this->super_DThinker,0x67);
  (this->super_DThinker).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_0070adc8;
  (this->SpawnedThings).Array = (TObjPtr<AActor> *)0x0;
  (this->SpawnedThings).Most = 0;
  (this->SpawnedThings).Count = 0;
  if ((ActiveThinker.field_0 == (DFraggleThinker *)0x0) ||
     ((*(byte *)((long)ActiveThinker.field_0 + 0x20) & 0x20) != 0)) {
    ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DFraggleThinker>_1)this;
    this_00 = (DRunningScript *)
              M_Malloc_Dbg(0xd8,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    DObject::DObject((DObject *)this_00);
    (this_00->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_0070ad80;
    (this_00->script).field_0.p = (DFsScript *)0x0;
    this_00->save_point = 0;
    this_00->wait_type = 0;
    this_00->wait_data = 0;
    memset(this_00->variables,0,0x98);
    (this->RunningScripts).field_0.p = this_00;
    this_01 = (DFsScript *)
              M_Malloc_Dbg(0x960,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/./dobject.h"
                           ,0x1f9);
    DObject::DObject((DObject *)this_01);
    (this_01->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_0070ad38;
    memset(this_01->children,0,0x808);
    this_01->data = (char *)0x0;
    memset(this_01->sections,0,0x108);
    this_01->scriptnum = -1;
    this_01->len = 0;
    (this_01->parent).field_0.p = (DFsScript *)0x0;
    (this_01->trigger).field_0.p = (AActor *)0x0;
    this_01->lastiftrue = false;
    (this->LevelScript).field_0.p = this_01;
    pDVar2 = global_script;
    if (((this_01->super_DObject).ObjectFlags & 0x20) != 0) {
      this_01 = (DFsScript *)0x0;
    }
    (this->LevelScript).field_0.p = this_01;
    (this_01->parent).field_0.p = pDVar2;
    pDVar1 = (this->RunningScripts).field_0.o;
    if (pDVar1 != (DObject *)0x0) {
      if ((pDVar1->ObjectFlags & 0x20) == 0) {
        if (((pDVar1->ObjectFlags & 3) != 0) &&
           (((this->super_DThinker).super_DObject.ObjectFlags & 4) != 0)) {
          GC::Barrier((DObject *)this,pDVar1);
        }
      }
      else {
        (this->RunningScripts).field_0.p = (DRunningScript *)0x0;
      }
    }
    pDVar1 = (this->LevelScript).field_0.o;
    if (pDVar1 != (DObject *)0x0) {
      if ((pDVar1->ObjectFlags & 0x20) == 0) {
        if (((pDVar1->ObjectFlags & 3) != 0) &&
           (((this->super_DThinker).super_DObject.ObjectFlags & 4) != 0)) {
          GC::Barrier((DObject *)this,pDVar1);
        }
      }
      else {
        (this->LevelScript).field_0.p = (DFsScript *)0x0;
      }
    }
    this->nocheckposition = false;
  }
  else {
    I_Error("Only one FraggleThinker is allowed to exist at a time.\nCheck your code.");
  }
  return;
}

Assistant:

DFraggleThinker::DFraggleThinker() 
: DThinker(STAT_SCRIPTS)
{
	if (ActiveThinker)
	{
		I_Error ("Only one FraggleThinker is allowed to exist at a time.\nCheck your code.");
	}
	else
	{
		ActiveThinker = this;
		RunningScripts = new DRunningScript;
		LevelScript = new DFsScript;
		LevelScript->parent = global_script;
		GC::WriteBarrier(this, RunningScripts);
		GC::WriteBarrier(this, LevelScript);
		nocheckposition = false;
	}
}